

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdblookup.c
# Opt level: O3

int benchmark(MMDB_s *mmdb,int iterations)

{
  int iVar1;
  clock_t cVar2;
  int iVar3;
  double dVar4;
  MMDB_entry_data_list_s *entry_data_list;
  MMDB_lookup_result_s result;
  char ip_address [16];
  MMDB_entry_data_list_s *local_78;
  clock_t local_70;
  MMDB_lookup_result_s local_68;
  char local_48 [24];
  
  local_70 = clock();
  if (0 < iterations) {
    iVar3 = iterations;
    do {
      random_ipv4(local_48);
      lookup_or_die(&local_68,mmdb,local_48);
      local_78 = (MMDB_entry_data_list_s *)0x0;
      if ((local_68.found_entry == true) &&
         (iVar1 = MMDB_get_entry_data_list(&local_68.entry,&local_78), iVar1 != 0)) {
        benchmark_cold_1();
        iVar3 = 5;
        goto LAB_00103245;
      }
      MMDB_free_entry_data_list(local_78);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  cVar2 = clock();
  dVar4 = (double)(cVar2 - local_70) / 1000000.0;
  fprintf(_stdout,"\n  Looked up %i addresses in %.2f seconds. %.2f lookups per second.\n\n",dVar4,
          (double)iterations / dVar4);
  iVar3 = 0;
LAB_00103245:
  MMDB_close(mmdb);
  return iVar3;
}

Assistant:

static int benchmark(MMDB_s *mmdb, int iterations) {
    char ip_address[16];
    int exit_code = 0;

    clock_t time = clock();

    for (int i = 0; i < iterations; i++) {
        random_ipv4(ip_address);

        MMDB_lookup_result_s result = lookup_or_die(mmdb, ip_address);
        MMDB_entry_data_list_s *entry_data_list = NULL;

        if (result.found_entry) {

            int status =
                MMDB_get_entry_data_list(&result.entry, &entry_data_list);

            if (MMDB_SUCCESS != status) {
                fprintf(stderr,
                        "Got an error looking up the entry data - %s\n",
                        MMDB_strerror(status));
                exit_code = 5;
                MMDB_free_entry_data_list(entry_data_list);
                goto end;
            }
        }

        MMDB_free_entry_data_list(entry_data_list);
    }

    time = clock() - time;
    double seconds = ((double)time / CLOCKS_PER_SEC);
    fprintf(stdout,
            "\n  Looked up %i addresses in %.2f seconds. %.2f lookups per "
            "second.\n\n",
            iterations,
            seconds,
            iterations / seconds);

end:
    MMDB_close(mmdb);

    return exit_code;
}